

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceListTestCase::verifyResourceIndexQuery
          (ResourceListTestCase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resourceList,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *referenceResources,GLuint program)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  pointer pbVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  pointer pbVar11;
  string queryString;
  long local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  long lVar6;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  uVar1 = *(undefined4 *)
           (Functional::(anonymous_namespace)::
            getProgramInterfaceGLEnum(deqp::gles31::Functional::ProgramInterface)::s_enums +
           (long)(int)this->m_programInterface * 4);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<(&local_1a8,
                  "Verifying GetProgramResourceIndex returns correct indices for resource names.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  lVar9 = 0;
  lVar8 = 0;
  bVar10 = 0;
  do {
    pbVar11 = (referenceResources->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = (referenceResources->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)pbVar7 - (long)pbVar11) >> 5) <= lVar8) {
      if (this->m_programInterface != PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING) {
        local_1e0 = 0;
        for (lVar8 = 0; lVar8 < (int)((ulong)((long)pbVar7 - (long)pbVar11) >> 5); lVar8 = lVar8 + 1
            ) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b0,"[0]",(allocator<char> *)&local_1d0);
          bVar2 = de::endsWith((string *)((long)&(pbVar11->_M_dataplus)._M_p + local_1e0),
                               (string *)local_1b0);
          std::__cxx11::string::~string((string *)local_1b0);
          if (bVar2) {
            std::__cxx11::string::substr
                      ((ulong)&local_1d0,
                       (long)&(((referenceResources->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       local_1e0);
            uVar4 = (**(code **)(lVar6 + 0x9a8))(program,uVar1,local_1d0._M_dataplus._M_p);
            dVar5 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar5,"query resource index",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                            ,0x466);
            if (uVar4 == 0xffffffff) {
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::operator<<(&local_1a8,"Error, query for \"");
              std::operator<<(&local_1a8,(string *)&local_1d0);
              std::operator<<(&local_1a8,"\" resulted in index GL_INVALID_INDEX.");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              bVar10 = 1;
            }
            else {
              pbVar11 = (resourceList->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((int)uVar4 <
                  (int)((ulong)((long)(resourceList->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11)
                       >> 5)) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1b0,&local_1d0,"[0]");
                bVar2 = std::operator!=(pbVar11 + uVar4,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_1b0);
                std::__cxx11::string::~string((string *)local_1b0);
                if (bVar2) {
                  local_1b0 = (undefined1  [8])
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                  std::operator<<(&local_1a8,"Error, query for \"");
                  std::operator<<(&local_1a8,(string *)&local_1d0);
                  std::operator<<(&local_1a8,"\" got index (index = ");
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
                  std::operator<<(&local_1a8,") of another resource (\"");
                  std::operator<<(&local_1a8,
                                  (string *)
                                  ((resourceList->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar4));
                  std::operator<<(&local_1a8,"\").");
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                  bVar10 = 1;
                }
              }
              else {
                local_1b0 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                std::operator<<(&local_1a8,"Error, query for \"");
                std::operator<<(&local_1a8,(string *)&local_1d0);
                std::operator<<(&local_1a8,"\" resulted in index ");
                std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
                std::operator<<(&local_1a8," (larger or equal to GL_ACTIVE_RESOURCES).");
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                bVar10 = 1;
              }
            }
            std::__cxx11::string::~string((string *)&local_1d0);
          }
          pbVar11 = (referenceResources->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar7 = (referenceResources->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_1e0 = local_1e0 + 0x20;
        }
      }
      return (bool)(~bVar10 & 1);
    }
    uVar4 = (**(code **)(lVar6 + 0x9a8))
                      (program,uVar1,*(undefined8 *)((long)&(pbVar11->_M_dataplus)._M_p + lVar9));
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"query resource index",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x449);
    if (uVar4 == 0xffffffff) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"Error, for active resource \"");
      std::operator<<(&local_1a8,
                      (string *)
                      ((long)&(((referenceResources->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar9));
      std::operator<<(&local_1a8,"\" got index GL_INVALID_INDEX.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_012ec4fb:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      bVar10 = 1;
    }
    else {
      pbVar11 = (resourceList->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(resourceList->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11) >> 5) <=
          (int)uVar4) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"Error, for active resource \"");
        std::operator<<(&local_1a8,
                        (string *)
                        ((long)&(((referenceResources->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar9));
        std::operator<<(&local_1a8,"\" got index ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::operator<<(&local_1a8," (larger or equal to GL_ACTIVE_RESOURCES).");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_012ec4fb;
      }
      bVar2 = std::operator!=(pbVar11 + uVar4,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(((referenceResources->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar9));
      if (bVar2) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"Error, for active resource \"");
        std::operator<<(&local_1a8,
                        (string *)
                        ((long)&(((referenceResources->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar9));
        std::operator<<(&local_1a8,"\" got index (index = ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::operator<<(&local_1a8,") of another resource (");
        std::operator<<(&local_1a8,
                        (string *)
                        ((resourceList->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar4));
        std::operator<<(&local_1a8,").");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        bVar10 = 1;
      }
    }
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 0x20;
  } while( true );
}

Assistant:

bool ResourceListTestCase::verifyResourceIndexQuery (const std::vector<std::string>& resourceList, const std::vector<std::string>& referenceResources, glw::GLuint program)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLenum		programInterface	= getProgramInterfaceGLEnum(m_programInterface);
	bool					error				= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying GetProgramResourceIndex returns correct indices for resource names." << tcu::TestLog::EndMessage;

	for (int ndx = 0; ndx < (int)referenceResources.size(); ++ndx)
	{
		const glw::GLuint index = gl.getProgramResourceIndex(program, programInterface, referenceResources[ndx].c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

		if (index == GL_INVALID_INDEX)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index GL_INVALID_INDEX." << tcu::TestLog::EndMessage;
			error = true;
		}
		else if ((int)index >= (int)resourceList.size())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index " << index << " (larger or equal to GL_ACTIVE_RESOURCES)." << tcu::TestLog::EndMessage;
			error = true;
		}
		else if (resourceList[index] != referenceResources[ndx])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index (index = " << index << ") of another resource (" << resourceList[index] << ")." << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	// Query for "name" should match "name[0]" except for XFB

	if (m_programInterface != PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING)
	{
		for (int ndx = 0; ndx < (int)referenceResources.size(); ++ndx)
		{
			if (de::endsWith(referenceResources[ndx], "[0]"))
			{
				const std::string	queryString	= referenceResources[ndx].substr(0, referenceResources[ndx].length()-3);
				const glw::GLuint	index		= gl.getProgramResourceIndex(program, programInterface, queryString.c_str());
				GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

				if (index == GL_INVALID_INDEX)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" resulted in index GL_INVALID_INDEX." << tcu::TestLog::EndMessage;
					error = true;
				}
				else if ((int)index >= (int)resourceList.size())
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" resulted in index " << index << " (larger or equal to GL_ACTIVE_RESOURCES)." << tcu::TestLog::EndMessage;
					error = true;
				}
				else if (resourceList[index] != queryString + "[0]")
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" got index (index = " << index << ") of another resource (\"" << resourceList[index] << "\")." << tcu::TestLog::EndMessage;
					error = true;
				}
			}
		}
	}

	return !error;
}